

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

void __thiscall license::License::write_license(License *this)

{
  pointer *Input;
  string *psVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *prVar4;
  pointer pCVar5;
  reference pbVar6;
  char *pcVar7;
  reference ppVar8;
  char *a_pValue;
  TKeyVal *section_00;
  char *pcVar9;
  locale *Loc;
  string local_620 [8];
  string signature;
  string license_for_sign;
  TKeyVal *section;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string feature;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  undefined1 local_528 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_v;
  undefined1 local_508 [8];
  string features;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  SI_Error local_49c;
  istream local_498 [4];
  SI_Error error;
  ifstream previous_license;
  undefined1 local_280 [8];
  CSimpleIniA ini;
  ostream *output_license;
  ofstream license_stream;
  License *this_local;
  
  std::ofstream::ofstream(&output_license);
  Loc = (locale *)0x0;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280,false,
             false,false);
  if (this->m_license_fname == (string *)0x0) {
    ini._96_8_ = &std::cout;
  }
  else {
    std::ifstream::ifstream(local_498,(string *)this->m_license_fname,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      create_license_path(this->m_license_fname);
    }
    else {
      local_49c = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                             local_280,local_498);
      if (local_49c != SI_OK) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,
                   "License file existing, but there were errors in loading it. Is it a license file?"
                  );
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_49c = 0;
    }
    Loc = (locale *)&output_license;
    psVar1 = this->m_license_fname;
    ini._96_8_ = Loc;
    std::operator|(_S_trunc,_S_bin);
    std::ofstream::open((string *)&output_license,(_Ios_Openmode)psVar1);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      features.field_2._M_local_buf[0xf] = '\x01';
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_4e0,"Can not create file [",this->m_license_fname);
      std::operator+(&local_4c0,&local_4e0,"].");
      std::runtime_error::runtime_error(prVar4,(string *)&local_4c0);
      features.field_2._M_local_buf[0xf] = '\0';
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::~ifstream(local_498);
  }
  Input = &feature_v.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::locale::locale((locale *)Input);
  boost::algorithm::to_upper_copy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
             (algorithm *)&this->m_feature_names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Input,Loc);
  std::locale::~locale
            ((locale *)
             &feature_v.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_528);
  boost::algorithm::is_any_of<char[2]>((is_any_ofF<char> *)&crypto,(char (*) [2])",");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_528,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
             (is_any_ofF<char> *)&crypto,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)&crypto);
  CryptoHelper::getInstance();
  pCVar5 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)&__range1);
  (*pCVar5->_vptr_CryptoHelper[3])(pCVar5,&this->m_private_key);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_528);
  feature.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_528);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&feature.field_2 + 8));
    if (!bVar3) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&__range2,(string *)pbVar6);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280,pcVar7
               ,"lic_ver",200,(char *)0x0,false,false);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->values_map);
    it.second.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->values_map);
    while( true ) {
      bVar3 = std::operator!=(&__end2,(_Self *)((long)&it.second.field_2 + 8));
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&section,ppVar8);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      a_pValue = (char *)std::__cxx11::string::c_str();
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280,
                 pcVar7,pcVar9,a_pValue,(char *)0x0,false);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&section);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    pcVar7 = (char *)std::__cxx11::string::c_str();
    section_00 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSection
                           ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                            local_280,pcVar7);
    print_for_sign((string *)((long)&signature.field_2 + 8),(string *)&__range2,section_00);
    pCVar5 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
             operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                         *)&__range1);
    (*pCVar5->_vptr_CryptoHelper[5])(local_620,pCVar5,(undefined1 *)((long)&signature.field_2 + 8));
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280,pcVar7
               ,"sig",pcVar9,(char *)0x0,false);
    std::__cxx11::string::~string(local_620);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280,
             (ostream *)ini._96_8_,true);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             &__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_528);
  std::__cxx11::string::~string((string *)local_508);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_280);
  std::ofstream::~ofstream(&output_license);
  return;
}

Assistant:

void License::write_license() {
	ofstream license_stream;
	ostream *output_license;
	CSimpleIniA ini;
	if (m_license_fname == nullptr) {
		output_license = &cout;
	} else {
		ifstream previous_license(*m_license_fname);
		if (previous_license.is_open()) {
			SI_Error error = ini.LoadData(previous_license);
			if (error != SI_Error::SI_OK) {
				throw runtime_error(
					"License file existing, but there were errors in loading it. Is it a license file?");
			}
		} else {
			// new license
			create_license_path(*m_license_fname);
		}
		output_license = &license_stream;
		license_stream.open(*m_license_fname, ios::trunc | ios::binary);
		if (!license_stream.is_open()) {
			throw runtime_error("Can not create file [" + *m_license_fname + "].");
		}
	}

	const string features = boost::to_upper_copy(m_feature_names);
	vector<string> feature_v;
	boost::algorithm::split(feature_v, features, boost::is_any_of(","));
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->loadPrivateKey_file(m_private_key);

	for (const string feature : feature_v) {
		ini.SetLongValue(feature.c_str(), "lic_ver", LICENSE_FILE_VERSION);
		for (auto it : values_map) {
			ini.SetValue(feature.c_str(), it.first.c_str(), it.second.c_str());
		}
		const CSimpleIniA::TKeyVal *section = ini.GetSection(feature.c_str());
		string license_for_sign = print_for_sign(feature, section);
		const string signature = crypto->signString(license_for_sign);
		ini.SetValue(feature.c_str(), LICENSE_SIGNATURE, signature.c_str());
	}
	ini.Save(*output_license, true);
}